

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O3

void tcmalloc::Static::InitLateMaybeRecursive(void)

{
  pthread_atfork(CentralCacheLockAll,CentralCacheUnlockAll,CentralCacheUnlockAll);
  return;
}

Assistant:

void Static::InitLateMaybeRecursive() {
#if !defined(__APPLE__) && !defined(_WIN32) && !defined(TCMALLOC_NO_ATFORK) \
  && !defined(__FreeBSD__) && !defined(_AIX)
  // OSX has it's own way of handling atfork in malloc (see
  // libc_override_osx.h).
  //
  // Windows doesn't do fork.
  //
  // FreeBSD and AIX seemingly cannot handle early pthread_atfork
  // calls. So we don't.
  //
  // For other OSes we do pthread_atfork even if standard seemingly
  // discourages pthread_atfork, asking apps to do only
  // async-signal-safe calls between fork and exec.
  //
  // We're deliberately attempting to register atfork handlers as part
  // of malloc initialization. So very early. This ensures that our
  // handler is called last and that means fork will try to grab
  // tcmalloc locks last avoiding possible issues with many other
  // locks that are held around calls to malloc. I.e. if we don't do
  // that, fork() grabbing malloc lock before such other lock would be
  // prone to deadlock, if some other thread holds other lock and
  // calls malloc.
  //
  // We still leave some way of disabling it via
  // -DTCMALLOC_NO_ATFORK. It looks like on glibc even with fully
  // static binaries malloc is really initialized very early. But I
  // can see how combination of static linking and other libc-s could
  // be less fortunate and allow some early app constructors to run
  // before malloc is ever called.

  pthread_atfork(
    CentralCacheLockAll,    // parent calls before fork
    CentralCacheUnlockAll,  // parent calls after fork
    CentralCacheUnlockAll); // child calls after fork
#endif
}